

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_tga(char *filename,int x,int y,int comp,void *data)

{
  int iVar1;
  int r;
  stbi__write_context s;
  int in_stack_00000068;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  stbi__write_context *in_stack_ffffffffffffff80;
  int local_4;
  
  memset(&stack0xffffffffffffff80,0,0x58);
  iVar1 = stbi__start_write_file
                    (in_stack_ffffffffffffff80,
                     (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    local_4 = stbi_write_tga_core((stbi__write_context *)CONCAT44(x,y),comp,in_stack_00000068,
                                  data._4_4_,(void *)s._80_8_);
    stbi__end_write_file((stbi__write_context *)0x445a4b);
  }
  return local_4;
}

Assistant:

STBIWDEF int stbi_write_tga(char const *filename, int x, int y, int comp, const void *data)
{
   stbi__write_context s = { 0 };
   if (stbi__start_write_file(&s,filename)) {
      int r = stbi_write_tga_core(&s, x, y, comp, (void *) data);
      stbi__end_write_file(&s);
      return r;
   } else
      return 0;
}